

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Count_Heap.h
# Opt level: O0

void __thiscall Count_Heap<4U>::Init(Count_Heap<4U> *this,Data<4U> *item)

{
  long lVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  ulong uVar4;
  Data<4U> *item_00;
  uint uVar5;
  Heap<4U> *in_RSI;
  long in_RDI;
  uint32_t choice;
  uint32_t position;
  uint32_t i;
  int *result;
  undefined8 in_stack_ffffffffffffffb8;
  uint num;
  Data<4U> *in_stack_ffffffffffffffc0;
  uint counter;
  
  auVar2 = ZEXT416(*(uint *)(in_RDI + 0x84)) * ZEXT816(4);
  uVar4 = auVar2._0_8_;
  if (auVar2._8_8_ != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  item_00 = (Data<4U> *)operator_new__(uVar4);
  for (counter = 0; counter < *(uint *)(in_RDI + 0x84); counter = counter + 1) {
    num = (uint)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
    uVar3 = Data<4U>::Hash(in_stack_ffffffffffffffc0,num);
    uVar5 = uVar3 % *(uint *)(in_RDI + 0x80);
    uVar3 = Data<4U>::Hash(in_stack_ffffffffffffffc0,num);
    lVar1 = *(long *)(*(long *)(in_RDI + 0x78) + (ulong)counter * 8);
    *(int *)(lVar1 + (ulong)uVar5 * 4) = COUNT[uVar3 & 1] + *(int *)(lVar1 + (ulong)uVar5 * 4);
    *(int *)item_00[counter].str =
         *(int *)(*(long *)(*(long *)(in_RDI + 0x78) + (ulong)counter * 8) + (ulong)uVar5 * 4) *
         COUNT[uVar3 & 1];
  }
  Get_Median((int *)in_RSI,(uint32_t)((ulong)*(undefined8 *)(in_RDI + 0x70) >> 0x20));
  Heap<4U>::Insert(in_RSI,item_00,counter);
  if (item_00 != (Data<4U> *)0x0) {
    operator_delete__(item_00);
  }
  return;
}

Assistant:

void Init(const Data<DATA_LEN>& item) {
		int* result = new int[hash_num];

		for (uint32_t i = 0; i < hash_num; ++i) {
			uint32_t position = item.Hash(i) % length;
			uint32_t choice = item.Hash(i + 101) & 1;
			counter[i][position] += COUNT[choice];
			result[i] = counter[i][position] * COUNT[choice];
		}

		heap->Insert(item, Get_Median(result, hash_num));
		delete[] result;
	}